

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p2sc_time.c
# Opt level: O0

void warn_cuc_decoded(guint32 s,guint32 f)

{
  guint32 ss;
  guint8 *unaff_retaddr;
  guint8 b [7];
  
  warn_cuc(unaff_retaddr);
  return;
}

Assistant:

static void warn_cuc_decoded(guint32 s, guint32 f) {
    /* re-encode CUC */
    guint8 b[SIZEOF_CUC];
    guint32 ss = GUINT32_TO_BE(s);

    memcpy(b, &ss, 4);
    b[4] = (f >> 16) & 0xff;
    b[5] = (f >> 8) & 0xff;
    b[6] = f & 0xff;
    warn_cuc(b);
}